

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeRef * __thiscall c4::yml::Tree::operator[](Tree *this,size_t i)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  undefined8 in_RDX;
  size_t in_RSI;
  NodeRef *in_RDI;
  size_t ch;
  char msg [68];
  size_t in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  Tree *in_stack_fffffffffffffec8;
  Tree *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  Location *in_stack_fffffffffffffee0;
  char (*msg_00) [71];
  long local_e8;
  undefined1 in_stack_ffffffffffffff20 [24];
  char local_b0 [4];
  char acStack_ac [4];
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 local_88 [80];
  size_t local_38;
  size_t sStack_30;
  Tree *local_28;
  Tree *pTStack_20;
  char *local_18;
  char (*local_8) [71];
  
  rootref(in_stack_fffffffffffffed0);
  msg_00 = (char (*) [71])&local_e8;
  local_8 = msg_00;
  if (local_e8 == 0) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location((Location *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                       in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    loc.name.str = (char *)in_RDX;
    loc.super_LineCol.offset = in_stack_ffffffffffffff20._0_8_;
    loc.super_LineCol.line = in_stack_ffffffffffffff20._8_8_;
    loc.super_LineCol.col = in_stack_ffffffffffffff20._16_8_;
    loc.name.len = in_RSI;
    error<71ul>(msg_00,loc);
    in_stack_fffffffffffffeb8 = local_38;
    in_stack_fffffffffffffec0 = sStack_30;
    in_stack_fffffffffffffec8 = local_28;
    in_stack_fffffffffffffed0 = pTStack_20;
    in_stack_fffffffffffffed8 = local_18;
  }
  if (*(long *)(*msg_00 + 8) == -1) {
    memcpy(local_88,"check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)",0x44);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(*(long *)*msg_00 + 0x58);
    Location::Location(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (size_t)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                       in_stack_fffffffffffffec0);
    in_stack_fffffffffffffec8 =
         (Tree *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    in_stack_fffffffffffffed0 =
         (Tree *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    in_stack_fffffffffffffeb8 = CONCAT44(acStack_ac,local_b0);
    in_stack_fffffffffffffec0 = CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    (*pcVar1)(local_88,0x44,*(undefined8 *)(*(long *)*msg_00 + 0x40));
  }
  sVar4 = child((Tree *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (sVar4 == 0xffffffffffffffff) {
    NodeRef::NodeRef((NodeRef *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    NodeRef::NodeRef((NodeRef *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     in_stack_fffffffffffffec0);
  }
  return in_RDI;
}

Assistant:

NodeRef Tree::operator[] (size_t i)
{
    return rootref()[i];
}